

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestRunnerMain.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *str;
  char *pcVar1;
  bool bVar2;
  deBool dVar3;
  Platform *platform;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  CommandLine cmdLine;
  DirArchive archive;
  TestRunner runner;
  ApiType local_148;
  char *local_140;
  char *local_138;
  char local_130;
  undefined7 uStack_12f;
  deUint32 local_120;
  ulong local_118;
  DirArchive local_110;
  TestRunner local_e8;
  
  local_140 = &local_130;
  local_148.m_bits = 2;
  local_138 = (char *)0x0;
  local_130 = '\0';
  local_120 = 0;
  if (1 < argc) {
    uVar5 = (ulong)(uint)argc;
    uVar7 = 1;
    bVar2 = false;
    local_118 = uVar5;
    do {
      str = argv[uVar7];
      dVar3 = deStringBeginsWith(str,"--type=");
      if (dVar3 == 0) {
        dVar3 = deStringBeginsWith(str,"--logdir=");
        pcVar1 = local_138;
        if (dVar3 == 0) {
          dVar3 = deStringBeginsWith(str,"--summary");
          if (dVar3 == 0) {
            dVar3 = deStringEqual(str,"--verbose");
            if (dVar3 == 0) break;
            local_120 = 3;
          }
          else {
            local_120 = 8;
          }
        }
        else {
          strlen(str + 9);
          std::__cxx11::string::_M_replace((ulong)&local_140,0,pcVar1,(ulong)(str + 9));
        }
      }
      else {
        if (parseCommandLine(CommandLine&,int,char_const**)::runTypes == '\0') {
          main_cold_1();
        }
        lVar6 = 8;
        while (dVar3 = deStringEqual(*(char **)(lVar6 + 0x2191ef8),str + 7), dVar3 == 0) {
          lVar6 = lVar6 + 0x10;
          if (lVar6 == 0xe8) goto LAB_00833b95;
        }
        local_148.m_bits =
             *(deUint32 *)((long)&parseCommandLine(CommandLine&,int,char_const**)::runTypes + lVar6)
        ;
        uVar5 = local_118;
      }
      uVar7 = uVar7 + 1;
      bVar2 = uVar5 <= uVar7;
    } while (uVar7 != uVar5);
LAB_00833b95:
    if (!bVar2) {
      printf("%s:\n",*argv);
      puts("  --type=[esN[M]|glNM] Conformance test run type. Choose from");
      puts("                       ES: es2, es3, es31, es32");
      puts("                       GL: gl30, gl31, gl32, gl33, gl40, gl41, gl42, gl43, gl44, gl45");
      puts("  --logdir=[path]      Destination directory for log files");
      puts("  --summary            Print summary without running the tests");
      puts("  --verbose            Print out and log more information");
      iVar4 = -1;
      goto LAB_00833c69;
    }
  }
  platform = createPlatform();
  tcu::DirArchive::DirArchive(&local_110,".");
  glcts::TestRunner::TestRunner
            (&local_e8,platform,&local_110.super_Archive,local_140,local_148,local_120);
  do {
    bVar2 = glcts::TestRunner::iterate(&local_e8);
  } while (bVar2);
  glcts::TestRunner::~TestRunner(&local_e8);
  tcu::DirArchive::~DirArchive(&local_110);
  (*platform->_vptr_Platform[1])(platform);
  iVar4 = 0;
LAB_00833c69:
  if (local_140 != &local_130) {
    operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
  }
  return iVar4;
}

Assistant:

int main(int argc, char** argv)
{
	CommandLine cmdLine;

	if (!parseCommandLine(cmdLine, argc, argv))
	{
		printHelp(argv[0]);
		return -1;
	}

	try
	{
		de::UniquePtr<tcu::Platform> platform(createPlatform());
		tcu::DirArchive				 archive(".");
		glcts::TestRunner runner(static_cast<tcu::Platform&>(*platform.get()), archive, cmdLine.dstLogDir.c_str(),
								 cmdLine.runType, cmdLine.flags);

		for (;;)
		{
			if (!runner.iterate())
				break;
		}
	}
	catch (const std::exception& e)
	{
		printf("ERROR: %s\n", e.what());
		return -1;
	}

	return 0;
}